

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O2

void __thiscall mir::inst::LoadInst::display(LoadInst *this,ostream *o)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  ostream *poVar1;
  undefined8 extraout_RDX;
  
  (**(this->super_Inst).dest.super_Displayable._vptr_Displayable)(&(this->super_Inst).dest);
  poVar1 = std::operator<<(o," = load ");
  UNRECOVERED_JUMPTABLE = *(this->src).super_Displayable._vptr_Displayable;
  (*UNRECOVERED_JUMPTABLE)(&this->src,poVar1,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void LoadInst::display(std::ostream& o) const {
  o << dest << " = load " << src;
}